

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  _Bool _Var1;
  __int32_t **pp_Var2;
  uint uVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  int f;
  int d;
  char str [3];
  
  _Var1 = getn("From (default=0): ",&d,0);
  iVar5 = 0;
  if (_Var1) {
    _Var1 = getn("To (default=1): ",&f,1);
    if (_Var1) {
      if (f < d) {
        puts("`To` must be bigger than `from`!");
        iVar5 = 1;
      }
      else {
        bVar6 = false;
        printf("[E]ven or [a]ny? [E/a]: ");
        fgets(str,3,_stdin);
        lVar4 = (long)str[0];
        if (lVar4 != 10) {
          pp_Var2 = __ctype_toupper_loc();
          bVar6 = (*pp_Var2)[lVar4] != 0x45;
        }
        uVar3 = 0;
        printf("Absolute? [y/N]: ");
        fgets(str,3,_stdin);
        bVar7 = true;
        if (str[0] == '\n') {
          pp_Var2 = __ctype_toupper_loc();
          bVar7 = (*pp_Var2)[10] == 0x59;
        }
        for (; d <= f; d = d + 1) {
          if ((byte)((bVar6 ^ 1U) & (byte)d) == 0) {
            iVar5 = -d;
            if (0 < d) {
              iVar5 = d;
            }
            if (!bVar7) {
              iVar5 = d;
            }
            uVar3 = uVar3 + iVar5;
          }
        }
        iVar5 = 0;
        printf("The sum is %d\n",(ulong)uVar3);
      }
    }
  }
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int d, f;
  bool even, absolute;

  if (
    !getn("From (default=0): ", &d, 0)
    || !getn("To (default=1): ", &f, 1)
  ) {return 0;}

  if (d > f) {
    printf("`To` must be bigger than `from`!\n");
    return 1;
  }

  char str[3];
  printf("[E]ven or [a]ny? [E/a]: ");
  fgets(str, sizeof str, stdin);
  even = *str == '\n' || toupper(*str) == 'E';

  printf("Absolute? [y/N]: ");
  fgets(str, sizeof str, stdin);
  absolute = *str != '\n' || toupper(*str) == 'Y';

  int sum = 0;

  for (int i = d; i <= f; i++) {
    if (!even || i % 2 == 0) sum += absolute ? abs(i) : i;
  }

  printf("The sum is %d\n", sum);

  return 0;
}